

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O0

void * coll_seq_remove_at(coll_seq_t *seq,size_t index)

{
  void *data;
  size_t i;
  node_t_conflict *cur;
  node_t_conflict *prev;
  size_t index_local;
  coll_seq_t *seq_local;
  
  if ((seq == (coll_seq_t *)0x0) || (seq->len <= index)) {
    seq_local = (coll_seq_t *)0x0;
  }
  else {
    cur = (node_t_conflict *)0x0;
    i = (size_t)seq->head;
    for (data = (void *)0x0; data < index; data = (void *)((long)data + 1)) {
      cur = (node_t_conflict *)i;
      i = *(size_t *)(i + 8);
    }
    if (cur == (node_t_conflict *)0x0) {
      seq->head = *(coll_seq_node_t **)(i + 8);
    }
    else {
      cur->next = *(coll_seq_node_t **)(i + 8);
    }
    seq_local = *(coll_seq_t **)i;
    free((void *)i);
    seq->len = seq->len - 1;
  }
  return seq_local;
}

Assistant:

void *coll_seq_remove_at(coll_seq_t *seq, size_t index) {
    if (!seq || index >= seq->len) {
        return NULL;
    }
    node_t *prev = NULL, *cur = seq->head;
    for (size_t i = 0; i < index; ++i) {
        prev = cur;
        cur = cur->next;
    }
    if (prev) {
        prev->next = cur->next;
    } else {
        seq->head = cur->next;
    }
    void *data = cur->data;
    free(cur);
    --(seq->len);
    return data;
}